

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl::~ConnectResponseImpl
          (ConnectResponseImpl *this)

{
  anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::~ConnectResponseImpl
            ((ConnectResponseImpl *)(this + -8));
  return;
}

Assistant:

~ConnectResponseImpl() noexcept(false) {
      if (fulfiller->isWaiting() || streamAndFulfiller.fulfiller->isWaiting()) {
        auto ex = KJ_EXCEPTION(FAILED,
            "service's connect() implementation never called accept() nor reject()");
        if (fulfiller->isWaiting()) {
          fulfiller->reject(kj::cp(ex));
        }
        if (streamAndFulfiller.fulfiller->isWaiting()) {
          streamAndFulfiller.fulfiller->reject(kj::mv(ex));
        }
      }
    }